

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O3

size_t beast::detail::base64::encode<void>(void *dest,void *src,size_t len)

{
  byte *pbVar1;
  ulong uVar2;
  char *out;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = (char *)dest;
  if (2 < len) {
    uVar2 = len / 3;
    pcVar4 = (char *)dest;
    do {
      *pcVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
      pcVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(*(byte *)((long)src + 1) >> 4) | (*src & 3) << 4];
      pcVar4[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(*(byte *)((long)src + 2) >> 6) + (*(byte *)((long)src + 1) & 0xf) * 4];
      pbVar1 = (byte *)((long)src + 2);
      src = (void *)((long)src + 3);
      pcVar4[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*pbVar1 & 0x3f]
      ;
      uVar2 = uVar2 - 1;
      pcVar3 = pcVar4 + 4;
      pcVar4 = pcVar4 + 4;
    } while (uVar2 != 0);
  }
  if (len % 3 == 1) {
    *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
    pcVar3[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(*src & 3) << 4];
    pcVar3[2] = '=';
  }
  else {
    if (len % 3 != 2) goto LAB_00190061;
    *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
    pcVar3[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uint)(*(byte *)((long)src + 1) >> 4) | (*src & 3) << 4];
    pcVar3[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(ulong)(*(byte *)((long)src + 1) & 0xf) * 4];
  }
  pcVar3[3] = '=';
  pcVar3 = pcVar3 + 4;
LAB_00190061:
  return (long)pcVar3 - (long)dest;
}

Assistant:

std::size_t
encode(void* dest, void const* src, std::size_t len)
{
    char*      out = static_cast<char*>(dest);
    char const* in = static_cast<char const*>(src);
    auto const tab = base64::get_alphabet();

    for(auto n = len / 3; n--;)
    {
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4) + ((in[1] & 0xf0) >> 4)];
        *out++ = tab[((in[2] & 0xc0) >> 6) + ((in[1] & 0x0f) << 2)];
        *out++ = tab[  in[2] & 0x3f];
        in += 3;
    }

    switch(len % 3)
    {
    case 2:
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4) + ((in[1] & 0xf0) >> 4)];
        *out++ = tab[                         (in[1] & 0x0f) << 2];
        *out++ = '=';
        break;

    case 1:
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4)];
        *out++ = '=';
        *out++ = '=';
        break;

    case 0:
        break;
    }

    return out - static_cast<char*>(dest);
}